

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  Byte BVar5;
  UInt32 UVar6;
  uint numMasked_00;
  uint uVar7;
  UInt16 *pUVar8;
  CPpmd_See *pCVar9;
  CPpmd_State *pCVar10;
  CPpmd_State **local_998;
  CPpmd_State **pps;
  Byte symbol_3;
  int k;
  uint numMasked;
  uint num;
  uint i_1;
  CPpmd_See *see;
  UInt32 hiCnt_1;
  UInt32 count_1;
  UInt32 freqSum;
  CPpmd_State *s_1;
  CPpmd_State *ps [256];
  uint j_1;
  Byte symbol_2;
  UInt16 *prob;
  uint j;
  Byte symbol_1;
  Byte symbol;
  UInt32 hiCnt;
  UInt32 count;
  uint i;
  CPpmd_State *s;
  size_t charMask [32];
  IPpmd7_RangeDec *rc_local;
  CPpmd7 *p_local;
  
  if (p->MinContext->NumStats == 1) {
    bVar1 = *(byte *)((long)&p->MinContext->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(int)(*(ushort *)(p->Base + p->MinContext->Suffix) - 1)];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar8 = p->BinSumm[(int)(bVar1 - 1)] +
             (p->PrevSuccess + (uint)bVar2 + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)p->MinContext->SummFreq] * 2 + (p->RunLength >> 0x1a & 0x20U));
    UVar6 = (*rc->DecodeBit)(rc,(UInt32)*pUVar8);
    if (UVar6 == 0) {
      *pUVar8 = (*pUVar8 + 0x80) - (short)((int)(*pUVar8 + 0x20) >> 7);
      p->FoundState = (CPpmd_State *)&p->MinContext->SummFreq;
      ps[0xff]._7_1_ = (byte)p->MinContext->SummFreq;
      Ppmd7_UpdateBin(p);
      return (uint)ps[0xff]._7_1_;
    }
    *pUVar8 = *pUVar8 - (short)((int)(*pUVar8 + 0x20) >> 7);
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(int)(uint)*pUVar8 >> 10];
    for (ps[0xff]._0_4_ = 0; (uint)ps[0xff] < 0x20; ps[0xff]._0_4_ = (uint)ps[0xff] + 8) {
      charMask[(ulong)(uint)ps[0xff] - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)(byte)p->MinContext->SummFreq - 8)) = 0;
    p->PrevSuccess = 0;
  }
  else {
    _count = (CPpmd_State *)(p->Base + p->MinContext->Stats);
    UVar6 = (*rc->GetThreshold)(rc,(UInt32)p->MinContext->SummFreq);
    j = (uint)_count->Freq;
    if (UVar6 < j) {
      (*rc->Decode)(rc,0,(UInt32)_count->Freq);
      p->FoundState = _count;
      bVar1 = _count->Symbol;
      Ppmd7_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    hiCnt = p->MinContext->NumStats - 1;
    do {
      pCVar10 = _count + 1;
      j = _count[1].Freq + j;
      if (UVar6 < j) {
        (*rc->Decode)(rc,j - _count[1].Freq,(UInt32)_count[1].Freq);
        p->FoundState = pCVar10;
        bVar1 = pCVar10->Symbol;
        Ppmd7_Update1(p);
        return (uint)bVar1;
      }
      hiCnt = hiCnt - 1;
      _count = pCVar10;
    } while (hiCnt != 0);
    if (p->MinContext->SummFreq <= UVar6) {
      return -2;
    }
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    (*rc->Decode)(rc,j,p->MinContext->SummFreq - j);
    for (prob._4_4_ = 0; prob._4_4_ < 0x20; prob._4_4_ = prob._4_4_ + 8) {
      charMask[(ulong)prob._4_4_ - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)pCVar10->Symbol - 8)) = 0;
    hiCnt = p->MinContext->NumStats - 1;
    do {
      *(undefined1 *)((long)charMask + ((ulong)_count[-1].Symbol - 8)) = 0;
      hiCnt = hiCnt - 1;
      _count = _count + -1;
    } while (hiCnt != 0);
  }
  while( true ) {
    numMasked_00 = (uint)p->MinContext->NumStats;
    do {
      p->OrderFall = p->OrderFall + 1;
      if (p->MinContext->Suffix == 0) {
        return -1;
      }
      p->MinContext = (CPpmd7_Context *)(p->Base + p->MinContext->Suffix);
    } while (p->MinContext->NumStats == numMasked_00);
    see._4_4_ = 0;
    numMasked = 0;
    uVar4 = p->MinContext->NumStats;
    _count_1 = (CPpmd_State *)(p->Base + p->MinContext->Stats);
    do {
      uVar7 = (uint)*(char *)((long)charMask + ((ulong)_count_1->Symbol - 8));
      see._4_4_ = (_count_1->Freq & uVar7) + see._4_4_;
      pCVar10 = _count_1 + 1;
      ps[(ulong)numMasked - 1] = _count_1;
      numMasked = numMasked - uVar7;
      _count_1 = pCVar10;
    } while (numMasked != uVar4 - numMasked_00);
    pCVar9 = Ppmd7_MakeEscFreq(p,numMasked_00,&hiCnt_1);
    hiCnt_1 = see._4_4_ + hiCnt_1;
    UVar6 = (*rc->GetThreshold)(rc,hiCnt_1);
    if (UVar6 < see._4_4_) break;
    if (hiCnt_1 <= UVar6) {
      return -2;
    }
    (*rc->Decode)(rc,see._4_4_,hiCnt_1 - see._4_4_);
    pCVar9->Summ = pCVar9->Summ + (short)hiCnt_1;
    do {
      numMasked = numMasked - 1;
      *(undefined1 *)((long)charMask + ((ulong)ps[(ulong)numMasked - 1]->Symbol - 8)) = 0;
    } while (numMasked != 0);
  }
  local_998 = &s_1;
  see._4_4_ = 0;
  while (see._4_4_ = (*local_998)->Freq + see._4_4_, see._4_4_ <= UVar6) {
    local_998 = local_998 + 1;
  }
  _count_1 = *local_998;
  (*rc->Decode)(rc,see._4_4_ - _count_1->Freq,(UInt32)_count_1->Freq);
  if ((pCVar9->Shift < 7) && (BVar5 = pCVar9->Count + 0xff, pCVar9->Count = BVar5, BVar5 == '\0')) {
    pCVar9->Summ = pCVar9->Summ << 1;
    bVar1 = pCVar9->Shift;
    pCVar9->Shift = bVar1 + 1;
    pCVar9->Count = (Byte)(3 << (bVar1 & 0x1f));
  }
  p->FoundState = _count_1;
  bVar1 = _count_1->Symbol;
  Ppmd7_Update2(p);
  return (uint)bVar1;
}

Assistant:

static int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);

    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);

    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}